

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
               *this,size_t bucket_cnt,hasher *hashfn,key_equal *eq,allocator_type *alloc)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  long in_RSI;
  undefined8 *in_RDI;
  size_t new_capacity;
  CompressedTuple<unsigned_long,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  *capacity;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  *this_00;
  size_t in_stack_ffffffffffffffc8;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffffd0;
  
  pcVar1 = EmptyGroup();
  *in_RDI = pcVar1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  capacity = (CompressedTuple<unsigned_long,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
              *)(in_RDI + 5);
  this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
             *)&stack0xffffffffffffffd5;
  std::allocator<char>::allocator((allocator *)this_00);
  CompressedTuple<unsigned_long,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>::
  CompressedTuple(capacity,0,this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd5);
  if (in_RSI != 0) {
    sVar2 = NormalizeCapacity((size_t)in_RDI);
    reset_growth_left(this_00,(size_t)capacity);
    initialize_slots(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_RDI[3] = sVar2;
  }
  return;
}

Assistant:

explicit raw_hash_set(size_t bucket_cnt, const hasher& hashfn = hasher(),
			                      const key_equal& eq = key_equal(),
			                      const allocator_type& alloc = allocator_type())
				: ctrl_(EmptyGroup()), settings_(0, hashfn, eq, alloc)
			{
				if (bucket_cnt) {
					size_t new_capacity = NormalizeCapacity(bucket_cnt);
					reset_growth_left(new_capacity);
					initialize_slots(new_capacity);
					capacity_ = new_capacity;
				}
			}